

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O1

MachineConfiguration **
MT32Emu::MachineConfiguration::getAllMachineConfigurations(Bit32u *itemCount)

{
  if (getAllMachineConfigurations(unsigned_int*)::romInfoLists == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_1_04 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_1_05 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_1_06 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_1_07 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_BLUER == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_2_03 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_2_04 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_2_06 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::MT32_2_07 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::CM32L_1_00 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::CM32L_1_02 == '\0') {
    getAllMachineConfigurations();
  }
  if (getAllMachineConfigurations(unsigned_int*)::CM32LN_1_00 == '\0') {
    getAllMachineConfigurations();
  }
  if (itemCount != (Bit32u *)0x0) {
    *itemCount = 0xc;
  }
  return getAllMachineConfigurations::MACHINE_CONFIGURATIONS;
}

Assistant:

const MachineConfiguration * const *MachineConfiguration::getAllMachineConfigurations(Bit32u *itemCount) {
	static const ROMInfoLists &romInfoLists = getROMInfoLists();
	static const MachineConfiguration MT32_1_04 = MachineConfiguration("mt32_1_04", romInfoLists.mt32_1_04.romInfos, romInfoLists.mt32_1_04.itemCount);
	static const MachineConfiguration MT32_1_05 = MachineConfiguration("mt32_1_05", romInfoLists.mt32_1_05.romInfos, romInfoLists.mt32_1_05.itemCount);
	static const MachineConfiguration MT32_1_06 = MachineConfiguration("mt32_1_06", romInfoLists.mt32_1_06.romInfos, romInfoLists.mt32_1_06.itemCount);
	static const MachineConfiguration MT32_1_07 = MachineConfiguration("mt32_1_07", romInfoLists.mt32_1_07.romInfos, romInfoLists.mt32_1_07.itemCount);
	static const MachineConfiguration MT32_BLUER = MachineConfiguration("mt32_bluer", romInfoLists.mt32_bluer.romInfos, romInfoLists.mt32_bluer.itemCount);
	static const MachineConfiguration MT32_2_03 = MachineConfiguration("mt32_2_03", romInfoLists.mt32_2_03.romInfos, romInfoLists.mt32_2_03.itemCount);
	static const MachineConfiguration MT32_2_04 = MachineConfiguration("mt32_2_04", romInfoLists.mt32_2_04.romInfos, romInfoLists.mt32_2_04.itemCount);
	static const MachineConfiguration MT32_2_06 = MachineConfiguration("mt32_2_06", romInfoLists.mt32_2_06.romInfos, romInfoLists.mt32_2_06.itemCount);
	static const MachineConfiguration MT32_2_07 = MachineConfiguration("mt32_2_07", romInfoLists.mt32_2_07.romInfos, romInfoLists.mt32_2_07.itemCount);
	static const MachineConfiguration CM32L_1_00 = MachineConfiguration("cm32l_1_00", romInfoLists.cm32l_1_00.romInfos, romInfoLists.cm32l_1_00.itemCount);
	static const MachineConfiguration CM32L_1_02 = MachineConfiguration("cm32l_1_02", romInfoLists.cm32l_1_02.romInfos, romInfoLists.cm32l_1_02.itemCount);
	static const MachineConfiguration CM32LN_1_00 = MachineConfiguration("cm32ln_1_00", romInfoLists.cm32ln_1_00.romInfos, romInfoLists.cm32ln_1_00.itemCount);
	static const MachineConfiguration * const MACHINE_CONFIGURATIONS[] = {
		&MT32_1_04, &MT32_1_05, &MT32_1_06, &MT32_1_07, &MT32_BLUER, &MT32_2_03, &MT32_2_04, &MT32_2_06, &MT32_2_07, &CM32L_1_00, &CM32L_1_02, &CM32LN_1_00, NULL
	};

	if (itemCount != NULL) *itemCount = _CALC_ARRAY_LENGTH(MACHINE_CONFIGURATIONS);
	return MACHINE_CONFIGURATIONS;
}